

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_f39c41::PathSimplifier::intersectNodes
          (PathSimplifier *this,
          QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *elements,
          BVHNode *elementNode,BVHNode *treeNode)

{
  uint uVar1;
  Element *e1;
  Element *e2;
  PathSimplifier *this_00;
  QPoint *pQVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  undefined1 *puVar9;
  int i;
  long lVar10;
  int iVar11;
  int i_1;
  int iVar12;
  int iVar13;
  long in_FS_OFFSET;
  bool bVar14;
  undefined1 local_b8 [32];
  undefined1 *puStack_98;
  undefined1 *local_90;
  undefined1 *puStack_88;
  undefined1 *local_80;
  undefined1 *puStack_78;
  undefined1 *local_70;
  undefined1 *puStack_68;
  undefined1 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((elementNode->minimum).xp.m_i < (treeNode->maximum).xp.m_i) {
    do {
      if ((((treeNode->maximum).yp.m_i <= (elementNode->minimum).yp.m_i) ||
          ((elementNode->maximum).xp.m_i <= (treeNode->minimum).xp.m_i)) ||
         ((elementNode->maximum).yp.m_i <= (treeNode->minimum).yp.m_i)) break;
      e1 = (treeNode->field_3).element;
      if (treeNode->type == Leaf) {
        e2 = (elementNode->field_3).element;
        uVar1 = *(uint *)&e1->field_0x38;
        if (e1 != e2 && (uVar1 >> 8 & 1) != 0) {
          this_00 = (PathSimplifier *)this->m_points;
          bVar6 = equalElements(this_00,e1,e2);
          if (!bVar6) {
            if (((char)uVar1 != '\x01') || (e2->field_0x38 != '\x01')) {
              local_b8._16_8_ = (long)local_b8 + 0x18;
              local_50 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
              local_60 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
              local_70 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
              local_80 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
              local_90 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_88 = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
              puStack_98 = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._0_8_ = (undefined1 *)0xc;
              local_b8._8_8_ = (undefined1 *)0x0;
              appendSeparatingAxes(this_00,(QVarLengthArray<QPoint,_12LL> *)local_b8,e2);
              appendSeparatingAxes
                        ((PathSimplifier *)this->m_points,(QVarLengthArray<QPoint,_12LL> *)local_b8,
                         (treeNode->field_3).element);
              if ((long)local_b8._8_8_ < 1) goto LAB_003f6c49;
              pQVar2 = this->m_points->buffer;
              puVar9 = (undefined1 *)0x0;
              goto LAB_003f6b86;
            }
            lVar10 = (this_00->m_elements).siz;
            local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            intersectionPoint((IntersectionPoint *)local_b8,
                              (QPoint *)(ulong)*(uint *)(lVar10 + (ulong)e2->indices[0] * 8),
                              (QPoint *)(ulong)*(uint *)(lVar10 + 4 + (ulong)e2->indices[0] * 8),
                              (QPoint *)(ulong)*(uint *)(lVar10 + (ulong)e2->indices[1] * 8),
                              (QPoint *)(ulong)*(uint *)(lVar10 + 4 + (ulong)e2->indices[1] * 8));
            if (local_b8._20_4_ != 0 && local_b8._8_4_ != 0) {
              uVar4 = local_b8._4_4_;
              bVar6 = (uint)(local_b8._4_4_ * 2) < (uint)local_b8._8_4_;
              iVar3 = local_b8._0_4_ + 1;
              uVar5 = local_b8._16_4_;
              bVar14 = (uint)(local_b8._16_4_ * 2) < (uint)local_b8._20_4_;
              iVar11 = local_b8._12_4_ + 1;
              QDataBuffer<QPoint>::reserve
                        ((QDataBuffer<QPoint> *)this_00,(this_00->m_elements).capacity + 1);
              *(ulong *)((this_00->m_elements).siz + (this_00->m_elements).capacity * 8) =
                   CONCAT44(iVar11 - (uint)bVar14,iVar3 - (uint)bVar6);
              (this_00->m_elements).capacity = (this_00->m_elements).capacity + 1;
              splitLineAt(this,elements,treeNode,(int)this->m_points->siz - 1,
                          uVar4 != 0 || uVar5 != 0);
              bVar6 = splitLineAt(this,elements,elementNode,(int)this->m_points->siz - 1,false);
              goto LAB_003f695f;
            }
          }
        }
        break;
      }
      bVar6 = intersectNodes(this,elements,elementNode,(BVHNode *)e1);
      if (bVar6) {
        bVar6 = true;
        goto LAB_003f695f;
      }
      treeNode = treeNode->right;
    } while ((elementNode->minimum).xp.m_i < (treeNode->maximum).xp.m_i);
  }
  bVar6 = false;
  goto LAB_003f695f;
  while (puVar9 = puVar9 + 1, puVar9 != (undefined1 *)local_b8._8_8_) {
LAB_003f6b86:
    iVar3 = *(int *)(local_b8._16_8_ + (long)puVar9 * 8);
    iVar11 = 0x7fffffff;
    iVar7 = -0x7fffffff;
    lVar10 = 0;
    do {
      uVar1 = ((elementNode->field_3).element)->indices[lVar10];
      iVar8 = pQVar2[uVar1].yp.m_i *
              *(int *)((undefined1 *)(local_b8._16_8_ + 4) + (long)puVar9 * 8) +
              pQVar2[uVar1].xp.m_i * iVar3;
      if (iVar8 <= iVar11) {
        iVar11 = iVar8;
      }
      if (iVar8 < iVar7) {
        iVar8 = iVar7;
      }
      iVar7 = iVar8;
      lVar10 = lVar10 + 1;
    } while ((ulong)(byte)((elementNode->field_3).element)->field_0x38 + 1 != lVar10);
    iVar8 = 0x7fffffff;
    iVar12 = -0x7fffffff;
    lVar10 = 0;
    do {
      uVar1 = ((treeNode->field_3).element)->indices[lVar10];
      iVar13 = pQVar2[uVar1].yp.m_i *
               *(int *)((undefined1 *)(local_b8._16_8_ + 4) + (long)puVar9 * 8) +
               pQVar2[uVar1].xp.m_i * iVar3;
      if (iVar13 <= iVar8) {
        iVar8 = iVar13;
      }
      if (iVar13 < iVar12) {
        iVar13 = iVar12;
      }
      iVar12 = iVar13;
      lVar10 = lVar10 + 1;
    } while ((ulong)(byte)((treeNode->field_3).element)->field_0x38 + 1 != lVar10);
    bVar6 = false;
    if ((iVar12 <= iVar11) || (iVar7 <= iVar8)) goto LAB_003f6cb2;
  }
LAB_003f6c49:
  if ((e1->field_0x38 & 0xfe) != 0) {
    splitCurve(this,elements,treeNode);
  }
  if ((e2->field_0x38 & 0xfe) == 0) {
    bVar14 = intersectNodes(this,elements,elementNode,(BVHNode *)(treeNode->field_3).element);
    bVar6 = true;
    if (!bVar14) {
      bVar6 = intersectNodes(this,elements,elementNode,treeNode->right);
    }
  }
  else {
    splitCurve(this,elements,elementNode);
    bVar6 = true;
  }
LAB_003f6cb2:
  if (local_b8._16_8_ != (long)local_b8 + 0x18) {
    QtPrivate::sizedFree((void *)local_b8._16_8_,local_b8._0_8_ << 3);
  }
LAB_003f695f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool PathSimplifier::intersectNodes(QDataBuffer<Element *> &elements, BVHNode *elementNode,
                                    BVHNode *treeNode)
{
    if (elementNode->minimum.x() >= treeNode->maximum.x()
        || elementNode->minimum.y() >= treeNode->maximum.y()
        || elementNode->maximum.x() <= treeNode->minimum.x()
        || elementNode->maximum.y() <= treeNode->minimum.y())
    {
        return false;
    }

    Q_ASSERT(elementNode->type == BVHNode::Leaf);
    Element *element = elementNode->element;
    Q_ASSERT(!element->processed);

    if (treeNode->type == BVHNode::Leaf) {
        Element *nodeElement = treeNode->element;
        if (!nodeElement->processed)
            return false;

        if (treeNode->element == elementNode->element)
            return false;

        if (equalElements(treeNode->element, elementNode->element))
            return false; // element doesn't split itself.

        if (element->degree == Element::Line && nodeElement->degree == Element::Line) {
            const QPoint &u1 = m_points->at(element->indices[0]);
            const QPoint &u2 = m_points->at(element->indices[1]);
            const QPoint &v1 = m_points->at(nodeElement->indices[0]);
            const QPoint &v2 = m_points->at(nodeElement->indices[1]);
            IntersectionPoint intersection = intersectionPoint(u1, u2, v1, v2);
            if (!intersection.isValid())
                return false;

            Q_ASSERT(intersection.x.integer >= qMin(u1.x(), u2.x()));
            Q_ASSERT(intersection.y.integer >= qMin(u1.y(), u2.y()));
            Q_ASSERT(intersection.x.integer >= qMin(v1.x(), v2.x()));
            Q_ASSERT(intersection.y.integer >= qMin(v1.y(), v2.y()));

            Q_ASSERT(intersection.x.integer <= qMax(u1.x(), u2.x()));
            Q_ASSERT(intersection.y.integer <= qMax(u1.y(), u2.y()));
            Q_ASSERT(intersection.x.integer <= qMax(v1.x(), v2.x()));
            Q_ASSERT(intersection.y.integer <= qMax(v1.y(), v2.y()));

            m_points->add(intersection.round());
            splitLineAt(elements, treeNode, m_points->size() - 1, !intersection.isAccurate());
            return splitLineAt(elements, elementNode, m_points->size() - 1, false);
        } else {
            QVarLengthArray<QPoint, 12> axes;
            appendSeparatingAxes(axes, elementNode->element);
            appendSeparatingAxes(axes, treeNode->element);
            for (int i = 0; i < axes.size(); ++i) {
                std::pair<int, int> range1 = calculateSeparatingAxisRange(axes.at(i), elementNode->element);
                std::pair<int, int> range2 = calculateSeparatingAxisRange(axes.at(i), treeNode->element);
                if (range1.first >= range2.second || range1.second <= range2.first) {
                    return false; // Separating axis found.
                }
            }
            // Bounding areas overlap.
            if (nodeElement->degree > Element::Line)
                splitCurve(elements, treeNode);
            if (element->degree > Element::Line) {
                splitCurve(elements, elementNode);
            } else {
                // The element was not split, so it can be processed further.
                if (intersectNodes(elements, elementNode, treeNode->left))
                    return true;
                if (intersectNodes(elements, elementNode, treeNode->right))
                    return true;
                return false;
            }
            return true;
        }
    } else {
        if (intersectNodes(elements, elementNode, treeNode->left))
            return true;
        if (intersectNodes(elements, elementNode, treeNode->right))
            return true;
        return false;
    }
}